

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O0

ndn_pit_entry_t * ndn_pit_find_or_insert(ndn_pit_t *self,uint8_t *name,size_t length)

{
  ndn_table_id_t nVar1;
  nametree_entry_t *entry_00;
  nametree_entry_t *entry;
  size_t length_local;
  uint8_t *name_local;
  ndn_pit_t *self_local;
  
  entry_00 = ndn_nametree_find_or_insert(self->nametree,name,length);
  if (entry_00 == (nametree_entry_t *)0x0) {
    self_local = (ndn_pit_t *)0x0;
  }
  else {
    if (entry_00->pit_id == 0xffff) {
      nVar1 = ndn_nametree_getid(self->nametree,entry_00);
      nVar1 = ndn_pit_add_new_entry(self,(uint)nVar1);
      entry_00->pit_id = nVar1;
      if (entry_00->pit_id == 0xffff) {
        return (ndn_pit_entry_t *)0x0;
      }
    }
    self_local = self + (ulong)entry_00->pit_id * 5 + 1;
  }
  return (ndn_pit_entry_t *)self_local;
}

Assistant:

ndn_pit_entry_t*
ndn_pit_find_or_insert(ndn_pit_t* self, uint8_t* name, size_t length){
  nametree_entry_t* entry = ndn_nametree_find_or_insert(self->nametree, name, length);
  if(entry == NULL){
    return NULL;
  }
  if(entry->pit_id == NDN_INVALID_ID){
    entry->pit_id = ndn_pit_add_new_entry(self, ndn_nametree_getid(self->nametree, entry));
    NDN_LOG_DEBUG("[PIT] Add a new PIT entry\n");
    if(entry->pit_id == NDN_INVALID_ID){
      return NULL;
    }
  }
  return &self->slots[entry->pit_id];
}